

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O0

ares_slist_node_t * ares_slist_insert(ares_slist_t *list,void *val)

{
  ares_slist_node_t *node_00;
  size_t sVar1;
  ares_slist_node_t **ppaVar2;
  void *ptr;
  ares_slist_node_t *node;
  void *val_local;
  ares_slist_t *list_local;
  
  if ((list == (ares_slist_t *)0x0) || (val == (void *)0x0)) {
    return (ares_slist_node_t *)0x0;
  }
  node_00 = (ares_slist_node_t *)ares_malloc_zero(0x28);
  if (node_00 != (ares_slist_node_t *)0x0) {
    node_00->data = val;
    node_00->parent = list;
    sVar1 = ares_slist_calc_level(list);
    node_00->levels = sVar1;
    ppaVar2 = (ares_slist_node_t **)ares_malloc_zero(node_00->levels << 3);
    node_00->next = ppaVar2;
    if (node_00->next != (ares_slist_node_t **)0x0) {
      ppaVar2 = (ares_slist_node_t **)ares_malloc_zero(node_00->levels << 3);
      node_00->prev = ppaVar2;
      if (node_00->prev != (ares_slist_node_t **)0x0) {
        if (list->levels < node_00->levels) {
          ppaVar2 = (ares_slist_node_t **)
                    ares_realloc_zero(list->head,list->levels << 3,node_00->levels << 3);
          if (ppaVar2 == (ares_slist_node_t **)0x0) goto LAB_001266e7;
          list->head = ppaVar2;
          list->levels = node_00->levels;
        }
        ares_slist_node_push(list,node_00);
        list->cnt = list->cnt + 1;
        return node_00;
      }
    }
  }
LAB_001266e7:
  if (node_00 != (ares_slist_node_t *)0x0) {
    ares_free(node_00->prev);
    ares_free(node_00->next);
    ares_free(node_00);
  }
  return (ares_slist_node_t *)0x0;
}

Assistant:

ares_slist_node_t *ares_slist_insert(ares_slist_t *list, void *val)
{
  ares_slist_node_t *node = NULL;

  if (list == NULL || val == NULL) {
    return NULL;
  }

  node = ares_malloc_zero(sizeof(*node));

  if (node == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->data   = val;
  node->parent = list;

  /* Randomly determine the number of levels we want to use */
  node->levels = ares_slist_calc_level(list);

  /* Allocate array of next and prev nodes for linking each level */
  node->next = ares_malloc_zero(sizeof(*node->next) * node->levels);
  if (node->next == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  node->prev = ares_malloc_zero(sizeof(*node->prev) * node->levels);
  if (node->prev == NULL) {
    goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
  }

  /* If the number of levels is greater than we currently support in the slist,
   * increase the count */
  if (list->levels < node->levels) {
    void *ptr =
      ares_realloc_zero(list->head, sizeof(*list->head) * list->levels,
                        sizeof(*list->head) * node->levels);
    if (ptr == NULL) {
      goto fail; /* LCOV_EXCL_LINE: OutOfMemory */
    }

    list->head   = ptr;
    list->levels = node->levels;
  }

  ares_slist_node_push(list, node);

  list->cnt++;

  return node;

/* LCOV_EXCL_START: OutOfMemory */
fail:
  if (node) {
    ares_free(node->prev);
    ares_free(node->next);
    ares_free(node);
  }
  return NULL;
  /* LCOV_EXCL_STOP */
}